

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

shared_ptr<QPDFLogger> __thiscall QPDFJob::getLogger(QPDFJob *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RSI;
  shared_ptr<QPDFLogger> sVar2;
  QPDFJob *this_local;
  
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RSI);
  std::shared_ptr<QPDFLogger>::shared_ptr((shared_ptr<QPDFLogger> *)this,&peVar1->log);
  sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFLogger>)sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFLogger>
QPDFJob::getLogger()
{
    return m->log;
}